

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.cc
# Opt level: O0

void __thiscall absl::substitute_internal::Arg::Arg(Arg *this,Hex hex)

{
  basic_string_view<char,_std::char_traits<char>_> *pbVar1;
  basic_string_view<char,_std::char_traits<char>_> *__str;
  byte in_DL;
  ulong in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  char *beg;
  uint64_t value;
  char *writer;
  char *end;
  size_t local_48;
  char *in_stack_ffffffffffffffc0;
  basic_string_view<char,_std::char_traits<char>_> *local_28;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI);
  pbVar1 = in_RDI + 3;
  local_28 = pbVar1;
  do {
    __str = (basic_string_view<char,_std::char_traits<char>_> *)((long)&local_28[-1]._M_str + 7);
    *(char *)((long)&local_28[-1]._M_str + 7) = "0123456789abcdef"[in_RSI & 0xf];
    in_RSI = in_RSI >> 4;
    local_28 = __str;
  } while (in_RSI != 0);
  if ((long)pbVar1 - (long)__str < (long)(ulong)in_DL) {
    __str = (basic_string_view<char,_std::char_traits<char>_> *)
            ((long)pbVar1 - (long)(int)(uint)in_DL);
    std::fill_n<char*,long,char>((char *)0x0,(long)__str,in_stack_ffffffffffffffc0);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&local_48,(char *)__str,
             (long)pbVar1 - (long)__str);
  in_RDI->_M_len = local_48;
  in_RDI->_M_str = in_stack_ffffffffffffffc0;
  return;
}

Assistant:

Arg::Arg(Hex hex) {
  char* const end = &scratch_[numbers_internal::kFastToBufferSize];
  char* writer = end;
  uint64_t value = hex.value;
  do {
    *--writer = absl::numbers_internal::kHexChar[value & 0xF];
    value >>= 4;
  } while (value != 0);

  char* beg;
  if (end - writer < hex.width) {
    beg = end - hex.width;
    std::fill_n(beg, writer - beg, hex.fill);
  } else {
    beg = writer;
  }

  piece_ = absl::string_view(beg, static_cast<size_t>(end - beg));
}